

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

RequestConnectOrProtocolError * __thiscall
kj::HttpHeaders::tryParseRequestOrConnect
          (RequestConnectOrProtocolError *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  Tag TVar2;
  NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *other;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *pOVar3;
  NullableValue<kj::StringPtr> *other_00;
  StringPtr *pSVar4;
  StringPtr **ppSVar5;
  ArrayPtr<char> content_00;
  ProtocolError local_350;
  ArrayPtr<const_char> local_318;
  ProtocolError local_308;
  StringPtr *local_2d0;
  Fault local_2c8;
  StringPtr *local_2c0;
  StringPtr *_kj_result_1;
  size_t sStack_2b0;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_2a8;
  HttpConnectMethod *local_268;
  HttpConnectMethod *_kj_switch_done_1;
  HttpConnectMethod *m_1;
  Fault local_250;
  StringPtr *local_248;
  StringPtr *_kj_result;
  char *local_238;
  size_t sStack_230;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_228;
  HttpMethod *local_1e8;
  HttpMethod *_kj_switch_done;
  HttpMethod *m;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_switch_subject;
  StringPtr local_1c8;
  StringPtr local_1b8;
  HttpHeaders *local_1a8;
  char *pcStack_1a0;
  StringPtr *local_198;
  StringPtr *p;
  undefined1 local_178 [8];
  NullableValue<kj::StringPtr> _p965;
  Maybe<kj::StringPtr> path;
  ProtocolError local_140;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *local_108;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_f0;
  undefined1 local_d8 [8];
  NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> _method957;
  RequestConnectOrProtocolError result;
  char *ptr;
  StringPtr SStack_70;
  StringPtr SStack_60;
  HttpHeaders *local_50;
  char *local_48;
  kj *local_40;
  char *local_38;
  char *local_30;
  char *end;
  HttpHeaders *this_local;
  ArrayPtr<char> content_local;
  
  local_38 = (char *)content.size_;
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = local_38;
  local_40 = content_00.size_;
  end = (char *)this;
  this_local = (HttpHeaders *)content_00.size_;
  content_local.ptr = local_38;
  content_local.size_ = (size_t)__return_storage_ptr__;
  local_30 = trimHeaderEnding(content_00.size_,content_00);
  if (local_30 == (char *)0x0) {
    ptr._0_4_ = 400;
    StringPtr::StringPtr(&SStack_70,"Bad Request");
    StringPtr::StringPtr(&SStack_60,"Request headers have no terminal newline.");
    local_50 = this_local;
    local_48 = content_local.ptr;
    OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>::
    OneOf<kj::HttpHeaders::ProtocolError,int>
              ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                *)__return_storage_ptr__,(ProtocolError *)&ptr);
  }
  else {
    result.field_1._48_8_ = ArrayPtr<char>::begin((ArrayPtr<char> *)&this_local);
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::OneOf((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
             *)((long)&_method957.field_1 + 8));
    consumeHttpMethod(&local_f0,(char **)((long)&result.field_1 + 0x30));
    other = kj::_::readMaybe<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>(&local_f0);
    kj::_::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::NullableValue
              ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_d8,other);
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~Maybe(&local_f0);
    pOVar3 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_d8);
    if (pOVar3 == (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0) {
      local_308.statusCode = 0x1f5;
      StringPtr::StringPtr(&local_308.statusMessage,"Not Implemented");
      StringPtr::StringPtr(&local_308.description,"Unrecognized request method.");
      local_308.rawContent.ptr = (char *)this_local;
      local_308.rawContent.size_ = (size_t)content_local.ptr;
      OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
      ::OneOf<kj::HttpHeaders::ProtocolError,int>
                ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                  *)__return_storage_ptr__,&local_308);
      bVar1 = true;
    }
    else {
      local_108 = kj::_::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator*
                            ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
                             local_d8);
      if ((*(char *)result.field_1._48_8_ == ' ') || (*(char *)result.field_1._48_8_ == '\t')) {
        result.field_1._48_8_ = result.field_1._48_8_ + 1;
        Maybe<kj::StringPtr>::Maybe((Maybe<kj::StringPtr> *)&_p965.field_1.value.content.size_);
        consumeWord((Maybe<kj::StringPtr> *)&p,(char **)((long)&result.field_1 + 0x30));
        other_00 = kj::_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)&p);
        kj::_::NullableValue<kj::StringPtr>::NullableValue
                  ((NullableValue<kj::StringPtr> *)local_178,other_00);
        Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)&p);
        pSVar4 = kj::_::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_178);
        bVar1 = pSVar4 == (StringPtr *)0x0;
        if (bVar1) {
          _kj_switch_subject._0_4_ = 400;
          StringPtr::StringPtr(&local_1c8,"Bad Request");
          StringPtr::StringPtr(&local_1b8,"Invalid request line.");
          local_1a8 = this_local;
          pcStack_1a0 = content_local.ptr;
          OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
          ::OneOf<kj::HttpHeaders::ProtocolError,int>
                    ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                      *)__return_storage_ptr__,(ProtocolError *)&_kj_switch_subject);
        }
        else {
          local_198 = kj::_::NullableValue<kj::StringPtr>::operator*
                                ((NullableValue<kj::StringPtr> *)local_178);
          Maybe<kj::StringPtr>::operator=
                    ((Maybe<kj::StringPtr> *)&_p965.field_1.value.content.size_,local_198);
        }
        kj::_::NullableValue<kj::StringPtr>::~NullableValue
                  ((NullableValue<kj::StringPtr> *)local_178);
        if (!bVar1) {
          m = &OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::_switchSubject(local_108)->tag;
          TVar2 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::which
                            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
          if (TVar2 == _variant0) {
            local_1e8 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpMethod>
                                  ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
            _kj_switch_done = local_1e8;
            while (local_1e8 != (HttpMethod *)0x0) {
              _kj_result._0_4_ = *_kj_switch_done;
              local_248 = kj::_::readMaybe<kj::StringPtr>
                                    ((Maybe<kj::StringPtr> *)&_p965.field_1.value.content.size_);
              if (local_248 == (StringPtr *)0x0) {
                kj::_::Debug::Fault::Fault
                          (&local_250,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                           ,0x3ce,FAILED,"path != nullptr","");
                kj::_::Debug::Fault::fatal(&local_250);
              }
              ppSVar5 = mv<kj::StringPtr*>(&local_248);
              m_1 = (HttpConnectMethod *)*ppSVar5;
              local_238 = *(char **)m_1;
              sStack_230 = *(size_t *)(m_1 + 8);
              OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
              ::OneOf<kj::HttpHeaders::Request,int>
                        ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                          *)&local_228,(Request *)&_kj_result);
              OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::operator=((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                           *)((long)&_method957.field_1 + 8),&local_228);
              OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::~OneOf(&local_228);
              local_1e8 = (HttpMethod *)0x0;
            }
          }
          else if (TVar2 == _variant1) {
            local_268 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpConnectMethod>
                                  ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
            _kj_switch_done_1 = local_268;
            while (local_268 != (HttpConnectMethod *)0x0) {
              local_2c0 = kj::_::readMaybe<kj::StringPtr>
                                    ((Maybe<kj::StringPtr> *)&_p965.field_1.value.content.size_);
              if (local_2c0 == (StringPtr *)0x0) {
                kj::_::Debug::Fault::Fault
                          (&local_2c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                           ,0x3d1,FAILED,"path != nullptr","");
                kj::_::Debug::Fault::fatal(&local_2c8);
              }
              ppSVar5 = mv<kj::StringPtr*>(&local_2c0);
              local_2d0 = *ppSVar5;
              _kj_result_1 = (StringPtr *)(local_2d0->content).ptr;
              sStack_2b0 = (local_2d0->content).size_;
              OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
              ::OneOf<kj::HttpHeaders::ConnectRequest,int>
                        ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                          *)&local_2a8,(ConnectRequest *)&_kj_result_1);
              OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::operator=((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                           *)((long)&_method957.field_1 + 8),&local_2a8);
              OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::~OneOf(&local_2a8);
              local_268 = (HttpConnectMethod *)0x0;
            }
          }
          bVar1 = false;
        }
        Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)&_p965.field_1.value.content.size_);
        if (!bVar1) {
          bVar1 = false;
        }
      }
      else {
        local_140.statusCode = 0x1f5;
        StringPtr::StringPtr(&local_140.statusMessage,"Not Implemented");
        StringPtr::StringPtr(&local_140.description,"Unrecognized request method.");
        local_140.rawContent.ptr = (char *)this_local;
        local_140.rawContent.size_ = (size_t)content_local.ptr;
        OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
        ::OneOf<kj::HttpHeaders::ProtocolError,int>
                  ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                    *)__return_storage_ptr__,&local_140);
        bVar1 = true;
      }
    }
    kj::_::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~NullableValue
              ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_d8);
    if (!bVar1) {
      local_318 = (ArrayPtr<const_char>)consumeLine((char **)((long)&result.field_1 + 0x30));
      bVar1 = parseHeaders(this,(char *)result.field_1._48_8_,local_30);
      if (bVar1) {
        OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
        ::OneOf(__return_storage_ptr__,
                (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                 *)((long)&_method957.field_1 + 8));
      }
      else {
        local_350.statusCode = 400;
        StringPtr::StringPtr(&local_350.statusMessage,"Bad Request");
        StringPtr::StringPtr
                  (&local_350.description,"The headers sent by your client are not valid.");
        local_350.rawContent.ptr = (char *)this_local;
        local_350.rawContent.size_ = (size_t)content_local.ptr;
        OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
        ::OneOf<kj::HttpHeaders::ProtocolError,int>
                  ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>
                    *)__return_storage_ptr__,&local_350);
      }
    }
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::~OneOf((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              *)((long)&_method957.field_1 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::RequestConnectOrProtocolError HttpHeaders::tryParseRequestOrConnect(
    kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 400, "Bad Request",
        "Request headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::RequestConnectOrProtocolError result;

  KJ_IF_SOME(method, consumeHttpMethod(ptr)) {
    if (*ptr != ' ' && *ptr != '\t') {
      return ProtocolError { 501, "Not Implemented",
          "Unrecognized request method.", content };
    }
    ++ptr;

    kj::Maybe<StringPtr> path;
    KJ_IF_SOME(p, consumeWord(ptr)) {
      path = p;
    } else {
      return ProtocolError { 400, "Bad Request",
          "Invalid request line.", content };
    }

    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        result = HttpHeaders::Request { m, KJ_ASSERT_NONNULL(path) };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        result = HttpHeaders::ConnectRequest { KJ_ASSERT_NONNULL(path) };
      }
    }
  }